

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

void __thiscall TypeInfo::TypeInfo(TypeInfo *this)

{
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  this->parser = (XercesDOMParser *)0x0;
  return;
}

Assistant:

TypeInfo::TypeInfo() {
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException &toCatch)
    {
        std::cerr << "Error during Xerces-c Initialization.\n"
             << "  Exception message:"
             << StrX(toCatch.getMessage()) << std::endl;
    }
    parser = 0;
}